

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O0

int4 power2Divide(int4 n,uint8 divisor,uint8 *q,uint8 *r)

{
  int4 iVar1;
  ulong uVar2;
  byte bVar3;
  uint8 local_70;
  uint8 tmpq;
  uint8 mult [2];
  uint8 fullpower [2];
  uint8 min;
  uint8 max;
  uint8 y;
  uint8 power;
  uint8 *r_local;
  uint8 *q_local;
  uint8 divisor_local;
  int4 n_local;
  
  if (divisor == 0) {
    divisor_local._4_4_ = 2;
  }
  else {
    bVar3 = (byte)n;
    if (n < 0x40) {
      uVar2 = 1L << (bVar3 & 0x3f);
      *q = uVar2 / divisor;
      *r = uVar2 % divisor;
      divisor_local._4_4_ = 0;
    }
    else {
      uVar2 = divisor >> (bVar3 - 0x40 & 0x3f);
      if (uVar2 == 0) {
        divisor_local._4_4_ = 1;
      }
      else {
        uVar2 = uVar2 >> 1;
        if (uVar2 == 0) {
          min = 0xffffffffffffffff;
          if (1L << (bVar3 - 0x40 & 0x3f) == divisor) {
            return 1;
          }
        }
        else {
          min = 0x8000000000000000 / uVar2 + 1;
        }
        fullpower[1] = 0x8000000000000000 / (uVar2 + 1);
        if (fullpower[1] != 0) {
          fullpower[1] = fullpower[1] - 1;
        }
        mult[1] = 0;
        tmpq = 0;
        mult[0] = 0;
        local_70 = 0;
        while (fullpower[1] + 1 < min) {
          uVar2 = min + fullpower[1];
          if (uVar2 < fullpower[1]) {
            local_70 = (uVar2 >> 1) + 0x8000000000000000;
          }
          else {
            local_70 = uVar2 >> 1;
          }
          mult64to128(&tmpq,divisor,local_70);
          iVar1 = unsignedCompare128(mult + 1,&tmpq);
          if (iVar1 < 0) {
            min = local_70 - 1;
          }
          else {
            fullpower[1] = local_70;
          }
        }
        if (local_70 != fullpower[1]) {
          mult64to128(&tmpq,divisor,fullpower[1]);
        }
        unsignedSubtract128(mult + 1,&tmpq);
        if ((1L << (bVar3 - 0x40 & 0x3f) == 0) && (mult[1] < divisor)) {
          *q = fullpower[1];
          *r = mult[1];
        }
        else {
          *q = fullpower[1] + 1;
          *r = mult[1] - divisor;
        }
        divisor_local._4_4_ = 0;
      }
    }
  }
  return divisor_local._4_4_;
}

Assistant:

int4 power2Divide(int4 n,uint8 divisor,uint8 &q,uint8 &r)

{
  if (divisor == 0) return 2;
  uint8 power = 1;
  if (n < 64) {
    power <<= n;
    q = power / divisor;
    r = power % divisor;
    return 0;
  }
  // Divide numerand and divisor by 2^(n-63) to get approximation of result
  uint8 y = divisor >> (n-64);	// Most of the way on divisor
  if (y == 0) return 1;		// Check if result will be too big
  y >>= 1;			// Divide divisor by final bit
  power <<= 63;
  uint8 max;
  if (y == 0) {
    max = 0;
    max -= 1;			// Could be maximal
    // Check if divisor is a power of 2
    if ((((uint8)1) << (n-64)) == divisor)
      return 1;
  }
  else
    max = power / y + 1;
  uint8 min = power / (y+1);
  if (min != 0)
    min -= 1;
  uint8 fullpower[2];
  fullpower[1] = ((uint8)1)<<(n-64);
  fullpower[0] = 0;
  uint8 mult[2];
  mult[0] = 0;
  mult[1] = 0;
  uint8 tmpq = 0;
  while(max > min+1) {
    tmpq = max + min;
    if (tmpq < min) {
      tmpq = (tmpq>>1) + 0x8000000000000000L;
    }
    else
      tmpq >>= 1;
    mult64to128(mult,divisor,tmpq);
    if (unsignedCompare128(fullpower,mult) < 0)
      max = tmpq-1;
    else
      min = tmpq;
  }
  // min is now our putative quotient
  if (tmpq != min)
    mult64to128(mult,divisor,min);
  unsignedSubtract128(fullpower,mult); // Calculate remainder
  // min might be 1 too small
  if (fullpower[1] != 0 || fullpower[0] >= divisor) {
    q = min + 1;
    r = fullpower[0] - divisor;
  }
  else {
    q = min;
    r = fullpower[0];
  }
  return 0;
}